

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic2::Run(UnitTest_semantic2 *this)

{
  Terminator *pTVar1;
  Terminator *pTVar2;
  Terminator *pTVar3;
  allocator local_69;
  string local_68;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_48;
  allocator local_40 [32];
  
  std::__cxx11::string::string((string *)&local_68,"f(a, b)",local_40);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)local_40,"f",&local_69);
  std::__cxx11::string::string((string *)&local_68,(string *)local_40);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_48,(FindName *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::string((string *)local_40,"a",&local_69);
  std::__cxx11::string::string((string *)&local_68,(string *)local_40);
  pTVar2 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_48,(FindName *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::string((string *)local_40,"b",&local_69);
  std::__cxx11::string::string((string *)&local_68,(string *)local_40);
  pTVar3 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_48,(FindName *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_40);
  if (pTVar1->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_68,"\'f->semantic_ == luna::SemanticOp_Read\'",local_40);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (pTVar2->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_68,"\'a->semantic_ == luna::SemanticOp_Read\'",local_40);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (pTVar3->semantic_ != SemanticOp_Read) {
    std::__cxx11::string::string
              ((string *)&local_68,"\'b->semantic_ == luna::SemanticOp_Read\'",local_40);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (local_48._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_48._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic2)
{
    auto ast = Semantic("f(a, b)");
    auto f = ASTFind<luna::Terminator>(ast, FindName("f"));
    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto b = ASTFind<luna::Terminator>(ast, FindName("b"));
    EXPECT_TRUE(f->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(a->semantic_ == luna::SemanticOp_Read);
    EXPECT_TRUE(b->semantic_ == luna::SemanticOp_Read);
}